

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3SnippetAdvance(char **ppIter,int *piIter,int iNext)

{
  int iIter;
  char *pIter;
  
  pIter = *ppIter;
  if (pIter != (char *)0x0) {
    iIter = *piIter;
    while (iIter < iNext) {
      if ((byte)*pIter < 2) {
        pIter = (char *)0x0;
        iIter = -1;
        break;
      }
      fts3GetDeltaPosition(&pIter,&iIter);
    }
    *piIter = iIter;
    *ppIter = pIter;
  }
  return;
}

Assistant:

static void fts3SnippetAdvance(char **ppIter, int *piIter, int iNext){
  char *pIter = *ppIter;
  if( pIter ){
    int iIter = *piIter;

    while( iIter<iNext ){
      if( 0==(*pIter & 0xFE) ){
        iIter = -1;
        pIter = 0;
        break;
      }
      fts3GetDeltaPosition(&pIter, &iIter);
    }

    *piIter = iIter;
    *ppIter = pIter;
  }
}